

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autogenerated_settings.cpp
# Opt level: O2

void duckdb::DebugVerifyVectorSetting::SetGlobal(DatabaseInstance *db,DBConfig *config,Value *input)

{
  DebugVectorVerification DVar1;
  string str_input;
  string local_50;
  string local_30;
  
  Value::GetValue<std::__cxx11::string>(&local_30,input);
  StringUtil::Upper(&local_50,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  DVar1 = EnumUtil::FromString<duckdb::DebugVectorVerification>(local_50._M_dataplus._M_p);
  (config->options).debug_verify_vector = DVar1;
  ::std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void DebugVerifyVectorSetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	auto str_input = StringUtil::Upper(input.GetValue<string>());
	config.options.debug_verify_vector = EnumUtil::FromString<DebugVectorVerification>(str_input);
}